

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_data.cpp
# Opt level: O2

void __thiscall duckdb::ClientData::ClientData(ClientData *this,ClientContext *context)

{
  shared_ptr<duckdb::AttachedDatabase,_true> *this_00;
  atomic<unsigned_long> *paVar1;
  __int_type _Var2;
  _Head_base<0UL,_duckdb::FileOpener_*,_false> _Var3;
  _Head_base<0UL,_duckdb::FileSystem_*,_false> _Var4;
  StorageOptions options;
  __uniq_ptr_impl<duckdb::RandomEngine,_std::default_delete<duckdb::RandomEngine>_> __p;
  _Head_base<0UL,_duckdb::FileOpener_*,_false> _Var5;
  _Head_base<0UL,_duckdb::FileSystem_*,_false> _Var6;
  type this_01;
  DatabaseManager *pDVar7;
  AttachedDatabase *pAVar8;
  _Head_base<0UL,_duckdb::RandomEngine_*,_false> local_80;
  undefined8 local_70;
  undefined8 local_68;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  
  (this->temporary_objects).internal.
  super___shared_ptr<duckdb::AttachedDatabase,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<duckdb::AttachedDatabase,_(__gnu_cxx::_Lock_policy)2>)0x0;
  (this->http_logger).internal.super___shared_ptr<duckdb::HTTPLogger,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<duckdb::HTTPLogger,_(__gnu_cxx::_Lock_policy)2>)0x0;
  (this->profiler).internal.super___shared_ptr<duckdb::QueryProfiler,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<duckdb::QueryProfiler,_(__gnu_cxx::_Lock_policy)2>)0x0;
  (this->prepared_statements)._M_h._M_buckets = &(this->prepared_statements)._M_h._M_single_bucket;
  (this->prepared_statements)._M_h._M_bucket_count = 1;
  (this->prepared_statements)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->prepared_statements)._M_h._M_element_count = 0;
  (this->prepared_statements)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_70 = &this->random_engine;
  local_68 = &this->catalog_search_path;
  *(undefined1 (*) [16])&(this->prepared_statements)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  this->log_query_writer =
       (unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>)0x0
  ;
  this->random_engine =
       (unique_ptr<duckdb::RandomEngine,_std::default_delete<duckdb::RandomEngine>_>)0x0;
  make_uniq<duckdb::CatalogSearchPath,duckdb::ClientContext&>((duckdb *)local_68,context);
  this->file_opener = (unique_ptr<duckdb::FileOpener,_std::default_delete<duckdb::FileOpener>_>)0x0;
  this->client_file_system =
       (unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>)0x0;
  (this->file_search_path)._M_dataplus._M_p = (pointer)&(this->file_search_path).field_2;
  (this->file_search_path)._M_string_length = 0;
  (this->file_search_path).field_2._M_local_buf[0] = '\0';
  this->debug_set_max_line_length = false;
  this->debug_max_line_length = 0;
  this_01 = shared_ptr<duckdb::DatabaseInstance,_true>::operator*(&context->db);
  make_shared_ptr<duckdb::QueryProfiler,duckdb::ClientContext&>
            ((ClientContext *)&stack0xffffffffffffff80);
  shared_ptr<duckdb::QueryProfiler,_true>::operator=
            (&this->profiler,(shared_ptr<duckdb::QueryProfiler,_true> *)&stack0xffffffffffffff80);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff88);
  make_shared_ptr<duckdb::HTTPLogger,duckdb::ClientContext&>
            ((ClientContext *)&stack0xffffffffffffff80);
  shared_ptr<duckdb::HTTPLogger,_true>::operator=
            (&this->http_logger,(shared_ptr<duckdb::HTTPLogger,_true> *)&stack0xffffffffffffff80);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff88);
  local_5c = 3;
  make_shared_ptr<duckdb::AttachedDatabase,duckdb::DatabaseInstance&,duckdb::AttachedDatabaseType>
            ((DatabaseInstance *)&stack0xffffffffffffff80,(AttachedDatabaseType *)this_01);
  this_00 = &this->temporary_objects;
  shared_ptr<duckdb::AttachedDatabase,_true>::operator=
            (this_00,(shared_ptr<duckdb::AttachedDatabase,_true> *)&stack0xffffffffffffff80);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff88);
  pDVar7 = DatabaseInstance::GetDatabaseManager(this_01);
  LOCK();
  paVar1 = &pDVar7->next_oid;
  _Var2 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  pAVar8 = shared_ptr<duckdb::AttachedDatabase,_true>::operator->(this_00);
  (pAVar8->super_CatalogEntry).oid = _Var2;
  make_uniq<duckdb::RandomEngine>();
  __p._M_t.
  super__Tuple_impl<0UL,_duckdb::RandomEngine_*,_std::default_delete<duckdb::RandomEngine>_>.
  super__Head_base<0UL,_duckdb::RandomEngine_*,_false>._M_head_impl =
       (tuple<duckdb::RandomEngine_*,_std::default_delete<duckdb::RandomEngine>_>)
       (tuple<duckdb::RandomEngine_*,_std::default_delete<duckdb::RandomEngine>_>)
       local_80._M_head_impl;
  local_80._M_head_impl = (RandomEngine *)0x0;
  ::std::__uniq_ptr_impl<duckdb::RandomEngine,_std::default_delete<duckdb::RandomEngine>_>::reset
            ((__uniq_ptr_impl<duckdb::RandomEngine,_std::default_delete<duckdb::RandomEngine>_> *)
             local_70,(pointer)__p._M_t.
                               super__Tuple_impl<0UL,_duckdb::RandomEngine_*,_std::default_delete<duckdb::RandomEngine>_>
                               .super__Head_base<0UL,_duckdb::RandomEngine_*,_false>._M_head_impl);
  ::std::unique_ptr<duckdb::RandomEngine,_std::default_delete<duckdb::RandomEngine>_>::~unique_ptr
            ((unique_ptr<duckdb::RandomEngine,_std::default_delete<duckdb::RandomEngine>_> *)
             &stack0xffffffffffffff80);
  make_uniq<duckdb::ClientContextFileOpener,duckdb::ClientContext&>
            ((duckdb *)&stack0xffffffffffffff80,context);
  _Var5._M_head_impl = (FileOpener *)local_80._M_head_impl;
  local_80._M_head_impl = (RandomEngine *)0x0;
  _Var3._M_head_impl =
       (this->file_opener).
       super_unique_ptr<duckdb::FileOpener,_std::default_delete<duckdb::FileOpener>_>._M_t.
       super___uniq_ptr_impl<duckdb::FileOpener,_std::default_delete<duckdb::FileOpener>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FileOpener_*,_std::default_delete<duckdb::FileOpener>_>.
       super__Head_base<0UL,_duckdb::FileOpener_*,_false>._M_head_impl;
  (this->file_opener).super_unique_ptr<duckdb::FileOpener,_std::default_delete<duckdb::FileOpener>_>
  ._M_t.super___uniq_ptr_impl<duckdb::FileOpener,_std::default_delete<duckdb::FileOpener>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileOpener_*,_std::default_delete<duckdb::FileOpener>_>.
  super__Head_base<0UL,_duckdb::FileOpener_*,_false>._M_head_impl = _Var5._M_head_impl;
  if (_Var3._M_head_impl != (FileOpener *)0x0) {
    (*(_Var3._M_head_impl)->_vptr_FileOpener[1])();
    if ((_Tuple_impl<0UL,_duckdb::RandomEngine_*,_std::default_delete<duckdb::RandomEngine>_>)
        local_80._M_head_impl != (RandomEngine *)0x0) {
      (*(*(_func_int ***)local_80._M_head_impl)[1])();
    }
  }
  make_uniq<duckdb::ClientFileSystem,duckdb::ClientContext&>
            ((duckdb *)&stack0xffffffffffffff80,context);
  _Var6._M_head_impl = (FileSystem *)local_80._M_head_impl;
  local_80._M_head_impl = (RandomEngine *)0x0;
  _Var4._M_head_impl =
       (this->client_file_system).
       super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
       super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
       super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl;
  (this->client_file_system).
  super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
  super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
  super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl = _Var6._M_head_impl;
  if (_Var4._M_head_impl != (FileSystem *)0x0) {
    (*(_Var4._M_head_impl)->_vptr_FileSystem[1])();
    if (local_80._M_head_impl != (RandomEngine *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
  }
  pAVar8 = shared_ptr<duckdb::AttachedDatabase,_true>::operator->(this_00);
  local_38 = 0;
  local_58 = 0xffffffff;
  uStack_54 = 0xffffffff;
  uStack_50 = 0xffffffff;
  uStack_4c = 0xffffffff;
  local_48 = 0xffffffff;
  uStack_44 = 0xffffffff;
  uStack_40 = 0xffffffff;
  uStack_3c = 0xffffffff;
  options.row_group_size.index = 0xffffffffffffffff;
  options.block_alloc_size.index = 0xffffffffffffffff;
  options.storage_version.index = 0xffffffffffffffff;
  options.block_header_size.index = 0xffffffffffffffff;
  options._32_8_ = 0;
  AttachedDatabase::Initialize(pAVar8,(optional_ptr<duckdb::ClientContext,_true>)0x0,options);
  return;
}

Assistant:

ClientData::ClientData(ClientContext &context) : catalog_search_path(make_uniq<CatalogSearchPath>(context)) {
	auto &db = DatabaseInstance::GetDatabase(context);
	profiler = make_shared_ptr<QueryProfiler>(context);
	http_logger = make_shared_ptr<HTTPLogger>(context);
	temporary_objects = make_shared_ptr<AttachedDatabase>(db, AttachedDatabaseType::TEMP_DATABASE);
	temporary_objects->oid = DatabaseManager::Get(db).NextOid();
	random_engine = make_uniq<RandomEngine>();
	file_opener = make_uniq<ClientContextFileOpener>(context);
	client_file_system = make_uniq<ClientFileSystem>(context);
	temporary_objects->Initialize();
}